

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O3

string * __thiscall
t_c_glib_generator::generate_free_func_from_type_abi_cxx11_
          (string *__return_storage_ptr__,t_c_glib_generator *this,t_type *ttype)

{
  long *plVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined8 *puVar4;
  char *pcVar5;
  char *pcVar6;
  
  if (ttype != (t_type *)0x0) {
    do {
      iVar3 = (*(((t_typedef *)ttype)->super_t_type).super_t_doc._vptr_t_doc[5])(ttype);
      if ((char)iVar3 != '\0') {
        iVar3 = *(int *)&((t_typedef *)ttype)->type_;
        if (iVar3 - 2U < 6) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        }
        else {
          if (iVar3 != 1) {
            if (iVar3 == 0) {
              puVar4 = (undefined8 *)__cxa_allocate_exception(8);
              pcVar5 = "compiler error: cannot determine hash type";
            }
            else {
              puVar4 = (undefined8 *)__cxa_allocate_exception(8);
              pcVar5 = "compiler error: no hash table info for type";
            }
            goto LAB_00156a9a;
          }
          iVar3 = (*(((t_typedef *)ttype)->super_t_type).super_t_doc._vptr_t_doc[7])(ttype);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          if ((char)iVar3 != '\0') {
            pcVar6 = "thrift_string_free";
            pcVar5 = "";
            goto LAB_00156a5c;
          }
        }
        pcVar6 = "g_free";
        pcVar5 = "";
        goto LAB_00156a5c;
      }
      iVar3 = (*(((t_typedef *)ttype)->super_t_type).super_t_doc._vptr_t_doc[10])(ttype);
      if ((char)iVar3 != '\0') break;
      iVar3 = (*(((t_typedef *)ttype)->super_t_type).super_t_doc._vptr_t_doc[0x10])(ttype);
      if (((char)iVar3 != '\0') ||
         (iVar3 = (*(((t_typedef *)ttype)->super_t_type).super_t_doc._vptr_t_doc[0xf])(ttype),
         (char)iVar3 != '\0')) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = "(GDestroyNotify) thrift_safe_hash_table_destroy";
        pcVar5 = "";
        goto LAB_00156a5c;
      }
      iVar3 = (*(((t_typedef *)ttype)->super_t_type).super_t_doc._vptr_t_doc[0xb])(ttype);
      if ((char)iVar3 != '\0') {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = "g_object_unref";
        pcVar5 = "";
        goto LAB_00156a5c;
      }
      iVar3 = (*(((t_typedef *)ttype)->super_t_type).super_t_doc._vptr_t_doc[0xe])(ttype);
      if ((char)iVar3 != '\0') {
        plVar1 = *(long **)&((t_typedef *)ttype)->forward_;
        cVar2 = (**(code **)(*plVar1 + 0x28))(plVar1);
        if (cVar2 == '\0') {
          cVar2 = (**(code **)(*plVar1 + 0x68))(plVar1);
          if ((cVar2 == '\0') && (cVar2 = (**(code **)(*plVar1 + 0x58))(plVar1), cVar2 == '\0')) {
            cVar2 = (**(code **)(*plVar1 + 0x50))(plVar1);
            if (cVar2 == '\0') {
              puVar4 = (undefined8 *)(**(code **)(*plVar1 + 0x18))(plVar1);
              printf("Type not expected inside the array: %s\n",*puVar4);
              puVar4 = (undefined8 *)__cxa_allocate_exception(8);
              pcVar5 = "Type not expected inside array";
              goto LAB_00156a9a;
            }
            goto LAB_00156a47;
          }
        }
        else {
          iVar3 = (int)plVar1[0x11];
          if (iVar3 - 2U < 6) {
LAB_00156a47:
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            pcVar6 = "(GDestroyNotify) g_array_unref";
            pcVar5 = "";
            goto LAB_00156a5c;
          }
          if (iVar3 != 1) {
            if (iVar3 == 0) {
              puVar4 = (undefined8 *)__cxa_allocate_exception(8);
              pcVar5 = "compiler error: cannot determine array type";
            }
            else {
              puVar4 = (undefined8 *)__cxa_allocate_exception(8);
              pcVar5 = "compiler error: no array info for type";
            }
            goto LAB_00156a9a;
          }
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = "(GDestroyNotify) g_ptr_array_unref";
        pcVar5 = "";
        goto LAB_00156a5c;
      }
      iVar3 = (*(((t_typedef *)ttype)->super_t_type).super_t_doc._vptr_t_doc[9])(ttype);
      if ((char)iVar3 == '\0') {
        iVar3 = (*(((t_typedef *)ttype)->super_t_type).super_t_doc._vptr_t_doc[3])(ttype);
        printf("Type not expected: %s\n",*(undefined8 *)CONCAT44(extraout_var,iVar3));
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        pcVar5 = "Type not expected";
LAB_00156a9a:
        *puVar4 = pcVar5;
        __cxa_throw(puVar4,&char_const*::typeinfo,0);
      }
      ttype = t_typedef::get_type((t_typedef *)ttype);
    } while ((t_typedef *)ttype != (t_typedef *)0x0);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar6 = "NULL";
  pcVar5 = "";
LAB_00156a5c:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar6,pcVar5);
  return __return_storage_ptr__;
}

Assistant:

string t_c_glib_generator::generate_free_func_from_type(t_type* ttype) {
  if (ttype == nullptr)
    return "NULL";

  if (ttype->is_base_type()) {
    t_base_type::t_base tbase = ((t_base_type*)ttype)->get_base();
    switch (tbase) {
    case t_base_type::TYPE_VOID:
      throw "compiler error: cannot determine hash type";
      break;
    case t_base_type::TYPE_BOOL:
    case t_base_type::TYPE_I8:
    case t_base_type::TYPE_I16:
    case t_base_type::TYPE_I32:
    case t_base_type::TYPE_I64:
    case t_base_type::TYPE_DOUBLE:
      return "g_free";
    case t_base_type::TYPE_STRING:
      if (((t_base_type*)ttype)->is_binary()) {
        return "thrift_string_free";
      }
      return "g_free";
    default:
      throw "compiler error: no hash table info for type";
    }
  } else if (ttype->is_enum()) {
    return "NULL";
  } else if (ttype->is_map() || ttype->is_set()) {
    return "(GDestroyNotify) thrift_safe_hash_table_destroy";
  } else if (ttype->is_struct()) {
    return "g_object_unref";
  } else if (ttype->is_list()) {
    t_type* etype = ((t_list*)ttype)->get_elem_type();
    if (etype->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)etype)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot determine array type";
        break;
      case t_base_type::TYPE_BOOL:
      case t_base_type::TYPE_I8:
      case t_base_type::TYPE_I16:
      case t_base_type::TYPE_I32:
      case t_base_type::TYPE_I64:
      case t_base_type::TYPE_DOUBLE:
        return "(GDestroyNotify) g_array_unref";
      case t_base_type::TYPE_STRING:
        return "(GDestroyNotify) g_ptr_array_unref";
      default:
        throw "compiler error: no array info for type";
      }
    } else if (etype->is_container() || etype->is_struct()) {
      return "(GDestroyNotify) g_ptr_array_unref";
      ;
    } else if (etype->is_enum()) {
      return "(GDestroyNotify) g_array_unref";
    }
    printf("Type not expected inside the array: %s\n", etype->get_name().c_str());
    throw "Type not expected inside array";
  } else if (ttype->is_typedef()) {
    return generate_free_func_from_type(((t_typedef*)ttype)->get_type());
  }
  printf("Type not expected: %s\n", ttype->get_name().c_str());
  throw "Type not expected";
}